

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

void __thiscall GlobOpt::FillBailOutInfo(GlobOpt *this,BasicBlock *block,BailOutInfo *bailOutInfo)

{
  OpCode OVar1;
  JitArenaAllocator *pJVar2;
  StackLiteralInitFldDataMap *pSVar3;
  BasicBlock *pBVar4;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  Opnd *pOVar6;
  _func_int **pp_Var7;
  code *pcVar8;
  bool bVar9;
  OpndKind OVar10;
  uint uVar11;
  BOOL BVar12;
  uint uVar13;
  undefined4 *puVar14;
  BVSparse<Memory::JitArenaAllocator> *pBVar15;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  StackLiteralBailOutInfo *pSVar16;
  StartCallInfo *pSVar17;
  Func **ppFVar18;
  StackSym **__s;
  Type *ppOVar19;
  StackSym *pSVar20;
  Value *pVVar21;
  uint uVar22;
  uint uVar23;
  BasicBlock *block_00;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  size_t requestedBytes;
  undefined1 local_78 [8];
  Iterator __iter;
  BVSparse<Memory::JitArenaAllocator> *local_58;
  ulong local_48;
  ulong local_38;
  
  if ((this->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3c7,"(!this->isCallHelper)",
                       "Bail out can\'t be inserted the middle of CallHelper sequence");
    if (!bVar9) goto LAB_00493ced;
    *puVar14 = 0;
  }
  pBVar15 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                      ((block->globOptData).liveVarSyms,this->func->m_alloc);
  bailOutInfo->liveVarSyms = pBVar15;
  pBVar15 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                      ((block->globOptData).liveFloat64Syms,this->func->m_alloc);
  bailOutInfo->liveFloat64Syms = pBVar15;
  block_00 = (BasicBlock *)(block->globOptData).liveInt32Syms;
  pBVar15 = (block->globOptData).liveLossyInt32Syms;
  pJVar2 = this->func->m_alloc;
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,pJVar2,0x3f1274);
  this_00->head = (Type_conflict)0x0;
  this_00->lastFoundIndex = (Type_conflict)0x0;
  this_00->alloc = pJVar2;
  this_00->lastUsedNodePrevNextField = (Type)this_00;
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            (this_00,(BVSparse<Memory::JitArenaAllocator> *)block_00,pBVar15);
  bailOutInfo->liveLosslessInt32Syms = this_00;
  pSVar3 = (block->globOptData).stackLiteralInitFldDataMap;
  if ((pSVar3 != (StackLiteralInitFldDataMap *)0x0) &&
     (uVar11 = pSVar3->count - pSVar3->freeCount, uVar11 != 0)) {
    pJVar2 = this->func->m_alloc;
    __iter.current = (NodeBase *)pSVar3;
    BVar12 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    block_00 = (BasicBlock *)((ulong)uVar11 << 4);
    pSVar16 = (StackLiteralBailOutInfo *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar2,(size_t)block_00);
    if (pSVar16 == (StackLiteralBailOutInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      block_00 = (BasicBlock *)0x1fe;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    if (*(int *)((long)&__iter.current[3].next + 4) == 0) {
      uVar23 = 0;
    }
    else {
      uVar23 = 0;
      puVar14 = (undefined4 *)__tls_get_addr();
      uVar24 = 0;
      block_00 = (BasicBlock *)__iter.current;
      do {
        iVar25 = *(int *)((long)&block_00->next->next + uVar24 * 4);
        while (iVar25 != -1) {
          pBVar4 = block_00->prev;
          lVar27 = (long)iVar25;
          iVar25 = (int)((Type *)&pBVar4->loop)[lVar27 * 4].word;
          pSVar20 = *(StackSym **)(&pBVar4->field_0x18 + lVar27 * 0x20);
          if (uVar11 <= uVar23) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x3e2,"(i < stackLiteralInitFldDataCount)",
                               "i < stackLiteralInitFldDataCount");
            if (!bVar9) goto LAB_00493ced;
            *puVar14 = 0;
            block_00 = (BasicBlock *)__iter.current;
          }
          pSVar16[uVar23].stackSym = pSVar20;
          pSVar16[uVar23].initFldCount = *(Type *)(&pBVar4->prev + lVar27 * 4);
          uVar23 = uVar23 + 1;
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 < *(uint *)&block_00->field_0x1c);
    }
    if (uVar23 != uVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      block_00 = (BasicBlock *)0x3e8;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,1000,"(i == stackLiteralInitFldDataCount)",
                         "i == stackLiteralInitFldDataCount");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    bailOutInfo->stackLiteralBailOutInfoCount = uVar11;
    bailOutInfo->stackLiteralBailOutInfo = pSVar16;
  }
  bVar9 = TrackArgumentsObject(this);
  if (bVar9) {
    CaptureArguments(this,block_00,bailOutInfo,this->func->m_alloc);
  }
  pSVar5 = (block->globOptData).callSequence;
  if ((pSVar5 == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
     ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar5->super_SListNodeBase<Memory::ArenaAllocator>).next == pSVar5)) {
    local_58 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
LAB_00493ccf:
    CaptureValues(this,block,bailOutInfo,local_58);
    return;
  }
  uVar11 = (block->globOptData).startCallCount;
  local_48 = (ulong)uVar11;
  if (local_48 == 0) {
    bailOutInfo->startCallInfo = (StartCallInfo *)&DAT_00000008;
    bailOutInfo->startCallCount = uVar11;
    ppFVar18 = (Func **)&DAT_00000008;
  }
  else {
    pSVar17 = (StartCallInfo *)
              new__<Memory::JitArenaAllocator>(local_48 * 4,this->func->m_alloc,0x3f1274);
    bailOutInfo->startCallInfo = pSVar17;
    bailOutInfo->startCallCount = uVar11;
    ppFVar18 = (Func **)new__<Memory::JitArenaAllocator>(local_48 << 3,this->func->m_alloc,0x3f1274)
    ;
  }
  bailOutInfo->startCallFunc = ppFVar18;
  uVar11 = (block->globOptData).totalOutParamCount;
  local_38 = (ulong)uVar11;
  bailOutInfo->totalOutParamCount = uVar11;
  if (local_38 == 0) {
    __s = (StackSym **)&DAT_00000008;
  }
  else {
    pJVar2 = this->func->m_alloc;
    BVar12 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar12 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    requestedBytes = local_38 * 8;
    __s = (StackSym **)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar2,
                     requestedBytes);
    memset(__s,0,requestedBytes);
    memset(__s + local_38,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + local_38 * -8);
    if (__s == (StackSym **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar9) {
LAB_00493ced:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar14 = 0;
    }
  }
  bailOutInfo->argOutSyms = __s;
  local_78 = (undefined1  [8])(block->globOptData).callSequence;
  __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)local_78;
  puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_58 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  do {
    uVar11 = (uint)local_38;
    uVar26 = 0;
    uVar23 = uVar11;
    while( true ) {
      uVar23 = uVar23 - 1;
      if (__iter.list == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar9) goto LAB_00493ced;
        *puVar14 = 0;
      }
      pSVar5 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
               ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar5 != local_78) {
        __iter.list = pSVar5;
      }
      iVar25 = (int)local_48;
      if ((undefined1  [8])pSVar5 == local_78) {
        if (uVar11 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x448,"(totalOutParamCount == 0)","totalOutParamCount == 0");
          if (!bVar9) goto LAB_00493ced;
          *puVar14 = 0;
        }
        if (iVar25 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x449,"(startCallNumber == 0)","startCallNumber == 0");
          if (!bVar9) goto LAB_00493ced;
          *puVar14 = 0;
        }
        if (uVar26 == 0) goto LAB_00493ccf;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x44a,"(currentArgOutCount == 0)","currentArgOutCount == 0");
        if (!bVar9) goto LAB_00493ced;
        *puVar14 = 0;
        goto LAB_00493ccf;
      }
      ppOVar19 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_78);
      pSVar20 = IR::Opnd::GetStackSym(*ppOVar19);
      uVar22 = *(uint *)&pSVar20->field_0x18;
      OVar10 = IR::Opnd::GetKind(*ppOVar19);
      if (((uVar22 >> 0x15 | uVar22 >> 0x14) & 1) == 0) break;
      pOVar6 = *ppOVar19;
      if (OVar10 == OpndKindSym) {
        OVar10 = IR::Opnd::GetKind(pOVar6);
        if (OVar10 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar9) goto LAB_00493ced;
          *puVar14 = 0;
        }
        pSVar20 = (StackSym *)pOVar6[1]._vptr_Opnd;
        if ((pSVar20->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar9) goto LAB_00493ced;
          *puVar14 = 0;
        }
        if (((pSVar20->field_0x1a & 0x10) != 0) && (*(short *)&(pSVar20->super_Sym).field_0x16 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
          if (!bVar9) goto LAB_00493ced;
          *puVar14 = 0;
        }
        if ((pSVar20->field_0x1a & 0x10) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x40d,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
          if (!bVar9) goto LAB_00493ced;
          *puVar14 = 0;
        }
        if ((pSVar20->field_0x18 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x40e,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar9) goto LAB_00493ced;
          *puVar14 = 0;
        }
        OVar1 = ((pSVar20->field_5).m_instrDef)->m_opcode;
        uVar22 = OVar1 - 0x1ed;
        if (((6 < uVar22) || ((0x4bU >> (uVar22 & 0x1f) & 1) == 0)) && (OVar1 != ArgOut_A)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x413,
                             "(sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic)"
                             ,
                             "sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic"
                            );
          if (!bVar9) goto LAB_00493ced;
          *puVar14 = 0;
        }
      }
      else {
        pSVar20 = IR::Opnd::GetStackSym(pOVar6);
        pVVar21 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar20->super_Sym);
        if (pVVar21 == (Value *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x418,"(this->currentBlock->globOptData.FindValue(sym))",
                             "this->currentBlock->globOptData.FindValue(sym)");
          if (!bVar9) goto LAB_00493ced;
          *puVar14 = 0;
        }
        if (local_58 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          local_58 = (BVSparse<Memory::JitArenaAllocator> *)
                     new<Memory::JitArenaAllocator>(0x20,this->tempAlloc,0x3f1274);
          pJVar2 = this->tempAlloc;
          local_58->head = (Type_conflict)0x0;
          local_58->lastFoundIndex = (Type_conflict)0x0;
          local_58->alloc = pJVar2;
          local_58->lastUsedNodePrevNextField = (Type)local_58;
        }
        BVSparse<Memory::JitArenaAllocator>::Set(local_58,(pSVar20->super_Sym).m_id);
      }
      if (uVar11 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x422,"(totalOutParamCount != 0)","totalOutParamCount != 0");
        if (!bVar9) goto LAB_00493ced;
        *puVar14 = 0;
      }
      if (uVar11 <= uVar26) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x423,"(totalOutParamCount > currentArgOutCount)",
                           "totalOutParamCount > currentArgOutCount");
        if (!bVar9) goto LAB_00493ced;
        *puVar14 = 0;
      }
      uVar26 = uVar26 + 1;
      bailOutInfo->argOutSyms[uVar23] = pSVar20;
    }
    if (OVar10 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x42d,"(opnd->IsRegOpnd())","opnd->IsRegOpnd()");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    pOVar6 = *ppOVar19;
    OVar10 = IR::Opnd::GetKind(pOVar6);
    if (OVar10 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    pp_Var7 = pOVar6[1]._vptr_Opnd;
    if (((*(byte *)((long)pp_Var7 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var7 + 0x16) == 0))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    if ((*(byte *)((long)pp_Var7 + 0x1a) & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x42f,"(!sym->IsArgSlotSym())","!sym->IsArgSlotSym()");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    if (((ulong)pp_Var7[3] & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x430,"(sym->m_isSingleDef)","sym->m_isSingleDef");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    if (*(short *)(pp_Var7[5] + 0x30) != 7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x431,"(sym->m_instrDef->m_opcode == Js::OpCode::StartCall)",
                         "sym->m_instrDef->m_opcode == Js::OpCode::StartCall");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    local_48 = (ulong)(iVar25 - 1U);
    if (iVar25 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x433,"(startCallNumber != 0)","startCallNumber != 0");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    bailOutInfo->startCallFunc[local_48] = *(Func **)(pp_Var7[5] + 0x20);
    uVar13 = IR::Instr::GetArgOutCount((Instr *)pp_Var7[5],true);
    local_38 = (ulong)(uVar11 - uVar13);
    if (uVar11 < uVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x43e,"(totalOutParamCount >= argOutCount)",
                         "totalOutParamCount >= argOutCount");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    if (uVar13 < uVar26) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x43f,"(argOutCount >= currentArgOutCount)",
                         "argOutCount >= currentArgOutCount");
      if (!bVar9) goto LAB_00493ced;
      *puVar14 = 0;
    }
    BailOutInfo::RecordStartCallInfo(bailOutInfo,iVar25 - 1U,(Instr *)pp_Var7[5]);
  } while( true );
}

Assistant:

void
GlobOpt::FillBailOutInfo(BasicBlock *block, BailOutInfo * bailOutInfo)
{
    AssertMsg(!this->isCallHelper, "Bail out can't be inserted the middle of CallHelper sequence");

    BVSparse<JitArenaAllocator>* argsToCapture = nullptr;

    bailOutInfo->liveVarSyms = block->globOptData.liveVarSyms->CopyNew(this->func->m_alloc);
    bailOutInfo->liveFloat64Syms = block->globOptData.liveFloat64Syms->CopyNew(this->func->m_alloc);
    // The live int32 syms in the bailout info are only the syms resulting from lossless conversion to int. If the int32 value
    // was created from a lossy conversion to int, the original var value cannot be re-materialized from the int32 value. So, the
    // int32 version is considered to be not live for the purposes of bailout, which forces the var or float versions to be used
    // directly for restoring the value during bailout. Otherwise, bailout may try to re-materialize the var value by converting
    // the lossily-converted int value back into a var, restoring the wrong value.
    bailOutInfo->liveLosslessInt32Syms =
        block->globOptData.liveInt32Syms->MinusNew(block->globOptData.liveLossyInt32Syms, this->func->m_alloc);

    // Save the stack literal init field count so we can null out the uninitialized fields
    StackLiteralInitFldDataMap * stackLiteralInitFldDataMap = block->globOptData.stackLiteralInitFldDataMap;
    if (stackLiteralInitFldDataMap != nullptr)
    {
        uint stackLiteralInitFldDataCount = stackLiteralInitFldDataMap->Count();
        if (stackLiteralInitFldDataCount != 0)
        {
            auto stackLiteralBailOutInfo = AnewArray(this->func->m_alloc,
                BailOutInfo::StackLiteralBailOutInfo, stackLiteralInitFldDataCount);
            uint i = 0;
            stackLiteralInitFldDataMap->Map(
                [stackLiteralBailOutInfo, stackLiteralInitFldDataCount, &i](StackSym * stackSym, StackLiteralInitFldData const& data)
            {
                Assert(i < stackLiteralInitFldDataCount);
                stackLiteralBailOutInfo[i].stackSym = stackSym;
                stackLiteralBailOutInfo[i].initFldCount = data.currentInitFldCount;
                i++;
            });

            Assert(i == stackLiteralInitFldDataCount);
            bailOutInfo->stackLiteralBailOutInfoCount = stackLiteralInitFldDataCount;
            bailOutInfo->stackLiteralBailOutInfo = stackLiteralBailOutInfo;
        }
    }

    if (TrackArgumentsObject())
    {
        this->CaptureArguments(block, bailOutInfo, this->func->m_alloc);
    }

    if (block->globOptData.callSequence && !block->globOptData.callSequence->Empty())
    {
        uint currentArgOutCount = 0;
        uint startCallNumber = block->globOptData.startCallCount;

        bailOutInfo->startCallInfo = JitAnewArray(this->func->m_alloc, BailOutInfo::StartCallInfo, startCallNumber);
        bailOutInfo->startCallCount = startCallNumber;

        // Save the start call's func to identify the function (inlined) that the call sequence is for
        // We might not have any arg out yet to get the function from
        bailOutInfo->startCallFunc = JitAnewArray(this->func->m_alloc, Func *, startCallNumber);
#ifdef _M_IX86
        bailOutInfo->inlinedStartCall = BVFixed::New(startCallNumber, this->func->m_alloc, false);
#endif
        uint totalOutParamCount = block->globOptData.totalOutParamCount;
        bailOutInfo->totalOutParamCount = totalOutParamCount;
        bailOutInfo->argOutSyms = JitAnewArrayZ(this->func->m_alloc, StackSym *, totalOutParamCount);

        FOREACH_SLISTBASE_ENTRY(IR::Opnd *, opnd, block->globOptData.callSequence)
        {
            if(opnd->GetStackSym()->HasArgSlotNum())
            {
                StackSym * sym;
                if(opnd->IsSymOpnd())
                {
                    sym = opnd->AsSymOpnd()->m_sym->AsStackSym();
                    Assert(sym->IsArgSlotSym());
                    Assert(sym->m_isSingleDef);
                    Assert(sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic);
                }
                else
                {
                    sym = opnd->GetStackSym();
                    Assert(this->currentBlock->globOptData.FindValue(sym));
                    // StackSym args need to be re-captured
                    if (!argsToCapture)
                    {
                        argsToCapture = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
                    }

                    argsToCapture->Set(sym->m_id);
                }

                Assert(totalOutParamCount != 0);
                Assert(totalOutParamCount > currentArgOutCount);
                currentArgOutCount++;
#pragma prefast(suppress:26000, "currentArgOutCount is never 0");
                bailOutInfo->argOutSyms[totalOutParamCount - currentArgOutCount] = sym;
                // Note that there could be ArgOuts below current bailout instr that belong to current call (currentArgOutCount < argOutCount),
                // in which case we will have nulls in argOutSyms[] in start of section for current call, because we fill from tail.
                // Example: StartCall 3, ArgOut1,.. ArgOut2, Bailout,.. Argout3 -> [NULL, ArgOut1, ArgOut2].
            }
            else
            {
                Assert(opnd->IsRegOpnd());
                StackSym * sym = opnd->AsRegOpnd()->m_sym;
                Assert(!sym->IsArgSlotSym());
                Assert(sym->m_isSingleDef);
                Assert(sym->m_instrDef->m_opcode == Js::OpCode::StartCall);

                Assert(startCallNumber != 0);
                startCallNumber--;

                bailOutInfo->startCallFunc[startCallNumber] = sym->m_instrDef->m_func;
#ifdef _M_IX86
                if (sym->m_isInlinedArgSlot)
                {
                    bailOutInfo->inlinedStartCall->Set(startCallNumber);
                }
#endif
                uint argOutCount = sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
                Assert(totalOutParamCount >= argOutCount);
                Assert(argOutCount >= currentArgOutCount);

                bailOutInfo->RecordStartCallInfo(startCallNumber, sym->m_instrDef);
                totalOutParamCount -= argOutCount;
                currentArgOutCount = 0;
            }
        }
        NEXT_SLISTBASE_ENTRY;

        Assert(totalOutParamCount == 0);
        Assert(startCallNumber == 0);
        Assert(currentArgOutCount == 0);
    }

    // Save the constant values that we know so we can restore them directly.
    // This allows us to dead store the constant value assign.
    this->CaptureValues(block, bailOutInfo, argsToCapture);
}